

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

CURLcode bindlocal(Curl_easy *data,curl_socket_t sockfd,int af,uint scope)

{
  undefined1 uVar1;
  uint uVar2;
  bool bVar3;
  char *pcVar4;
  uint16_t uVar5;
  int iVar6;
  if2ip_result_t iVar7;
  size_t sVar8;
  char *pcVar9;
  uint *puVar10;
  bool bVar11;
  char local_498 [8];
  char buffer_1 [256];
  char buffer [256];
  undefined1 local_290 [4];
  curl_socklen_t size;
  Curl_sockaddr_storage add;
  char *scope_ptr;
  int rc;
  char local_1f8;
  uchar ipver;
  _Bool is_host;
  _Bool is_interface;
  int done;
  char myhost [256];
  undefined4 local_f0;
  uint local_ec;
  int on;
  int error;
  char *dev;
  int portnum;
  unsigned_short port;
  Curl_dns_entry *h;
  sockaddr_in6 *si6;
  sockaddr_in *si4;
  sockaddr *psStack_b8;
  curl_socklen_t sizeof_sa;
  sockaddr *sock;
  Curl_sockaddr_storage sa;
  connectdata *conn;
  uint scope_local;
  int af_local;
  curl_socket_t sockfd_local;
  Curl_easy *data_local;
  
  sa.buffer.sa_stor.__ss_align = (unsigned_long)data->conn;
  psStack_b8 = (sockaddr *)&sock;
  si4._4_4_ = 0;
  si6 = (sockaddr_in6 *)&sock;
  h = (Curl_dns_entry *)&sock;
  _portnum = (Curl_dns_entry *)0x0;
  dev._6_2_ = (data->set).localport;
  dev._0_4_ = (data->set).localportrange;
  _on = (data->set).str[8];
  local_f0 = 1;
  if ((_on == (char *)0x0) && (dev._6_2_ == 0)) {
    return CURLE_OK;
  }
  memset(&sock,0,0x80);
  if ((_on == (char *)0x0) || (sVar8 = strlen(_on), 0xfe < sVar8)) {
    if (af == 10) {
      *(undefined2 *)&h->addr = 10;
      uVar5 = htons(dev._6_2_);
      *(uint16_t *)((long)&h->addr + 2) = uVar5;
      si4._4_4_ = 0x1c;
    }
    else if (af == 2) {
      si6->sin6_family = 2;
      uVar5 = htons(dev._6_2_);
      si6->sin6_port = uVar5;
      si4._4_4_ = 0x10;
    }
  }
  else {
    memset(&local_1f8,0,0x100);
    pcVar4 = _on;
    pcVar9 = bindlocal::if_prefix;
    rc = 0;
    bVar3 = false;
    bVar11 = false;
    sVar8 = strlen(bindlocal::if_prefix);
    iVar6 = strncmp(pcVar9,pcVar4,sVar8);
    pcVar4 = _on;
    pcVar9 = bindlocal::host_prefix;
    if (iVar6 == 0) {
      sVar8 = strlen(bindlocal::if_prefix);
      _on = _on + sVar8;
      bVar3 = true;
    }
    else {
      sVar8 = strlen(bindlocal::host_prefix);
      iVar6 = strncmp(pcVar9,pcVar4,sVar8);
      bVar11 = iVar6 == 0;
      if (bVar11) {
        sVar8 = strlen(bindlocal::host_prefix);
        _on = _on + sVar8;
      }
    }
    pcVar9 = _on;
    if (!bVar11) {
      sVar8 = strlen(_on);
      iVar6 = setsockopt(sockfd,1,0x19,pcVar9,(int)sVar8 + 1);
      if (iVar6 == 0) {
        return CURLE_OK;
      }
      iVar7 = Curl_if2ip(af,scope,*(uint *)(sa.buffer.sa_stor.__ss_align + 0x574),_on,&local_1f8,
                         0x100);
      if (iVar7 == IF2IP_NOT_FOUND) {
        if (bVar3) {
          Curl_failf(data,"Couldn\'t bind to interface \'%s\'",_on);
          return CURLE_INTERFACE_FAILED;
        }
      }
      else {
        if (iVar7 == IF2IP_AF_NOT_SUPPORTED) {
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
        if (iVar7 == IF2IP_FOUND) {
          bVar3 = true;
          Curl_infof(data,"Local Interface %s is ip %s using address family %i",_on,&local_1f8,
                     (ulong)(uint)af);
          rc = 1;
        }
      }
    }
    if (!bVar3) {
      uVar1 = *(undefined1 *)(sa.buffer.sa_stor.__ss_align + 0x57e);
      if (af == 2) {
        *(undefined1 *)(sa.buffer.sa_stor.__ss_align + 0x57e) = 1;
      }
      else if (af == 10) {
        *(undefined1 *)(sa.buffer.sa_stor.__ss_align + 0x57e) = 2;
      }
      Curl_resolv(data,_on,0,false,(Curl_dns_entry **)&portnum);
      *(undefined1 *)(sa.buffer.sa_stor.__ss_align + 0x57e) = uVar1;
      if (_portnum == (Curl_dns_entry *)0x0) {
        rc = -1;
      }
      else {
        Curl_printable_address(_portnum->addr,&local_1f8,0x100);
        Curl_infof(data,"Name \'%s\' family %i resolved to \'%s\' family %i",_on,(ulong)(uint)af,
                   &local_1f8,(ulong)(uint)_portnum->addr->ai_family);
        Curl_resolv_unlock(data,_portnum);
        if (af != _portnum->addr->ai_family) {
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
        rc = 1;
      }
    }
    if (0 < rc) {
      if (af == 10) {
        pcVar9 = strchr(&local_1f8,0x25);
        add.buffer.sa_stor.__ss_align = (unsigned_long)pcVar9;
        if (pcVar9 != (char *)0x0) {
          add.buffer.sa_stor.__ss_align = (unsigned_long)(pcVar9 + 1);
          *pcVar9 = '\0';
        }
        iVar6 = inet_pton(10,&local_1f8,&h->timestamp);
        if (0 < iVar6) {
          *(undefined2 *)&h->addr = 10;
          uVar5 = htons(dev._6_2_);
          *(uint16_t *)((long)&h->addr + 2) = uVar5;
          if (add.buffer.sa_stor.__ss_align != 0) {
            iVar6 = atoi((char *)add.buffer.sa_stor.__ss_align);
            *(int *)&h[1].addr = iVar6;
          }
        }
        si4._4_4_ = 0x1c;
      }
      else if ((af == 2) && (iVar6 = inet_pton(2,&local_1f8,&si6->sin6_flowinfo), 0 < iVar6)) {
        si6->sin6_family = 2;
        uVar5 = htons(dev._6_2_);
        si6->sin6_port = uVar5;
        si4._4_4_ = 0x10;
      }
    }
    if (rc < 1) {
      *(uint *)&(data->state).field_0x6d0 = *(uint *)&(data->state).field_0x6d0 & 0xfffffff7;
      Curl_failf(data,"Couldn\'t bind to \'%s\'",_on);
      return CURLE_INTERFACE_FAILED;
    }
  }
  setsockopt(sockfd,0,0x18,&local_f0,4);
  while( true ) {
    iVar6 = bind(sockfd,psStack_b8,si4._4_4_);
    if (-1 < iVar6) {
      buffer[0xfc] = -0x80;
      buffer[0xfd] = '\0';
      buffer[0xfe] = '\0';
      buffer[0xff] = '\0';
      memset(local_290,0,0x80);
      iVar6 = getsockname(sockfd,(sockaddr *)local_290,(socklen_t *)(buffer + 0xfc));
      if (iVar6 < 0) {
        puVar10 = (uint *)__errno_location();
        uVar2 = *puVar10;
        (data->state).os_errno = uVar2;
        local_ec = uVar2;
        pcVar9 = Curl_strerror(uVar2,buffer_1 + 0xf8,0x100);
        Curl_failf(data,"getsockname() failed with errno %d: %s",(ulong)uVar2,pcVar9);
        data_local._4_4_ = CURLE_INTERFACE_FAILED;
      }
      else {
        Curl_infof(data,"Local port: %hu",(ulong)dev._6_2_);
        *(uint *)(sa.buffer.sa_stor.__ss_align + 0x374) =
             *(uint *)(sa.buffer.sa_stor.__ss_align + 0x374) & 0xff7fffff | 0x800000;
        data_local._4_4_ = CURLE_OK;
      }
      return data_local._4_4_;
    }
    dev._0_4_ = (int)dev + -1;
    if (((int)dev < 1) || (dev._6_2_ = dev._6_2_ + 1, dev._6_2_ == 0)) break;
    Curl_infof(data,"Bind to local port %hu failed, trying next",(ulong)(dev._6_2_ - 1));
    if (psStack_b8->sa_family == 2) {
      uVar5 = ntohs(dev._6_2_);
      si6->sin6_port = uVar5;
    }
    else {
      uVar5 = ntohs(dev._6_2_);
      *(uint16_t *)((long)&h->addr + 2) = uVar5;
    }
  }
  puVar10 = (uint *)__errno_location();
  uVar2 = *puVar10;
  (data->state).os_errno = uVar2;
  local_ec = uVar2;
  pcVar9 = Curl_strerror(uVar2,local_498,0x100);
  Curl_failf(data,"bind failed with errno %d: %s",(ulong)uVar2,pcVar9);
  return CURLE_INTERFACE_FAILED;
}

Assistant:

static CURLcode bindlocal(struct Curl_easy *data,
                          curl_socket_t sockfd, int af, unsigned int scope)
{
  struct connectdata *conn = data->conn;
  struct Curl_sockaddr_storage sa;
  struct sockaddr *sock = (struct sockaddr *)&sa;  /* bind to this address */
  curl_socklen_t sizeof_sa = 0; /* size of the data sock points to */
  struct sockaddr_in *si4 = (struct sockaddr_in *)&sa;
#ifdef ENABLE_IPV6
  struct sockaddr_in6 *si6 = (struct sockaddr_in6 *)&sa;
#endif

  struct Curl_dns_entry *h = NULL;
  unsigned short port = data->set.localport; /* use this port number, 0 for
                                                "random" */
  /* how many port numbers to try to bind to, increasing one at a time */
  int portnum = data->set.localportrange;
  const char *dev = data->set.str[STRING_DEVICE];
  int error;
#ifdef IP_BIND_ADDRESS_NO_PORT
  int on = 1;
#endif
#ifndef ENABLE_IPV6
  (void)scope;
#endif

  /*************************************************************
   * Select device to bind socket to
   *************************************************************/
  if(!dev && !port)
    /* no local kind of binding was requested */
    return CURLE_OK;

  memset(&sa, 0, sizeof(struct Curl_sockaddr_storage));

  if(dev && (strlen(dev)<255) ) {
    char myhost[256] = "";
    int done = 0; /* -1 for error, 1 for address found */
    bool is_interface = FALSE;
    bool is_host = FALSE;
    static const char *if_prefix = "if!";
    static const char *host_prefix = "host!";

    if(strncmp(if_prefix, dev, strlen(if_prefix)) == 0) {
      dev += strlen(if_prefix);
      is_interface = TRUE;
    }
    else if(strncmp(host_prefix, dev, strlen(host_prefix)) == 0) {
      dev += strlen(host_prefix);
      is_host = TRUE;
    }

    /* interface */
    if(!is_host) {
#ifdef SO_BINDTODEVICE
      /* I am not sure any other OSs than Linux that provide this feature,
       * and at the least I cannot test. --Ben
       *
       * This feature allows one to tightly bind the local socket to a
       * particular interface.  This will force even requests to other
       * local interfaces to go out the external interface.
       *
       *
       * Only bind to the interface when specified as interface, not just
       * as a hostname or ip address.
       *
       * interface might be a VRF, eg: vrf-blue, which means it cannot be
       * converted to an IP address and would fail Curl_if2ip. Simply try
       * to use it straight away.
       */
      if(setsockopt(sockfd, SOL_SOCKET, SO_BINDTODEVICE,
                    dev, (curl_socklen_t)strlen(dev) + 1) == 0) {
        /* This is typically "errno 1, error: Operation not permitted" if
         * you're not running as root or another suitable privileged
         * user.
         * If it succeeds it means the parameter was a valid interface and
         * not an IP address. Return immediately.
         */
        return CURLE_OK;
      }
#endif

      switch(Curl_if2ip(af,
#ifdef ENABLE_IPV6
                        scope, conn->scope_id,
#endif
                        dev, myhost, sizeof(myhost))) {
        case IF2IP_NOT_FOUND:
          if(is_interface) {
            /* Do not fall back to treating it as a host name */
            failf(data, "Couldn't bind to interface '%s'", dev);
            return CURLE_INTERFACE_FAILED;
          }
          break;
        case IF2IP_AF_NOT_SUPPORTED:
          /* Signal the caller to try another address family if available */
          return CURLE_UNSUPPORTED_PROTOCOL;
        case IF2IP_FOUND:
          is_interface = TRUE;
          /*
           * We now have the numerical IP address in the 'myhost' buffer
           */
          infof(data, "Local Interface %s is ip %s using address family %i",
                dev, myhost, af);
          done = 1;
          break;
      }
    }
    if(!is_interface) {
      /*
       * This was not an interface, resolve the name as a host name
       * or IP number
       *
       * Temporarily force name resolution to use only the address type
       * of the connection. The resolve functions should really be changed
       * to take a type parameter instead.
       */
      unsigned char ipver = conn->ip_version;
      int rc;

      if(af == AF_INET)
        conn->ip_version = CURL_IPRESOLVE_V4;
#ifdef ENABLE_IPV6
      else if(af == AF_INET6)
        conn->ip_version = CURL_IPRESOLVE_V6;
#endif

      rc = Curl_resolv(data, dev, 0, FALSE, &h);
      if(rc == CURLRESOLV_PENDING)
        (void)Curl_resolver_wait_resolv(data, &h);
      conn->ip_version = ipver;

      if(h) {
        /* convert the resolved address, sizeof myhost >= INET_ADDRSTRLEN */
        Curl_printable_address(h->addr, myhost, sizeof(myhost));
        infof(data, "Name '%s' family %i resolved to '%s' family %i",
              dev, af, myhost, h->addr->ai_family);
        Curl_resolv_unlock(data, h);
        if(af != h->addr->ai_family) {
          /* bad IP version combo, signal the caller to try another address
             family if available */
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
        done = 1;
      }
      else {
        /*
         * provided dev was no interface (or interfaces are not supported
         * e.g. solaris) no ip address and no domain we fail here
         */
        done = -1;
      }
    }

    if(done > 0) {
#ifdef ENABLE_IPV6
      /* IPv6 address */
      if(af == AF_INET6) {
#ifdef HAVE_SOCKADDR_IN6_SIN6_SCOPE_ID
        char *scope_ptr = strchr(myhost, '%');
        if(scope_ptr)
          *(scope_ptr++) = 0;
#endif
        if(Curl_inet_pton(AF_INET6, myhost, &si6->sin6_addr) > 0) {
          si6->sin6_family = AF_INET6;
          si6->sin6_port = htons(port);
#ifdef HAVE_SOCKADDR_IN6_SIN6_SCOPE_ID
          if(scope_ptr)
            /* The "myhost" string either comes from Curl_if2ip or from
               Curl_printable_address. The latter returns only numeric scope
               IDs and the former returns none at all.  So the scope ID, if
               present, is known to be numeric */
            si6->sin6_scope_id = atoi(scope_ptr);
#endif
        }
        sizeof_sa = sizeof(struct sockaddr_in6);
      }
      else
#endif
      /* IPv4 address */
      if((af == AF_INET) &&
         (Curl_inet_pton(AF_INET, myhost, &si4->sin_addr) > 0)) {
        si4->sin_family = AF_INET;
        si4->sin_port = htons(port);
        sizeof_sa = sizeof(struct sockaddr_in);
      }
    }

    if(done < 1) {
      /* errorbuf is set false so failf will overwrite any message already in
         the error buffer, so the user receives this error message instead of a
         generic resolve error. */
      data->state.errorbuf = FALSE;
      failf(data, "Couldn't bind to '%s'", dev);
      return CURLE_INTERFACE_FAILED;
    }
  }
  else {
    /* no device was given, prepare sa to match af's needs */
#ifdef ENABLE_IPV6
    if(af == AF_INET6) {
      si6->sin6_family = AF_INET6;
      si6->sin6_port = htons(port);
      sizeof_sa = sizeof(struct sockaddr_in6);
    }
    else
#endif
    if(af == AF_INET) {
      si4->sin_family = AF_INET;
      si4->sin_port = htons(port);
      sizeof_sa = sizeof(struct sockaddr_in);
    }
  }
#ifdef IP_BIND_ADDRESS_NO_PORT
  (void)setsockopt(sockfd, SOL_IP, IP_BIND_ADDRESS_NO_PORT, &on, sizeof(on));
#endif
  for(;;) {
    if(bind(sockfd, sock, sizeof_sa) >= 0) {
      /* we succeeded to bind */
      struct Curl_sockaddr_storage add;
      curl_socklen_t size = sizeof(add);
      memset(&add, 0, sizeof(struct Curl_sockaddr_storage));
      if(getsockname(sockfd, (struct sockaddr *) &add, &size) < 0) {
        char buffer[STRERROR_LEN];
        data->state.os_errno = error = SOCKERRNO;
        failf(data, "getsockname() failed with errno %d: %s",
              error, Curl_strerror(error, buffer, sizeof(buffer)));
        return CURLE_INTERFACE_FAILED;
      }
      infof(data, "Local port: %hu", port);
      conn->bits.bound = TRUE;
      return CURLE_OK;
    }

    if(--portnum > 0) {
      port++; /* try next port */
      if(port == 0)
        break;
      infof(data, "Bind to local port %hu failed, trying next", port - 1);
      /* We re-use/clobber the port variable here below */
      if(sock->sa_family == AF_INET)
        si4->sin_port = ntohs(port);
#ifdef ENABLE_IPV6
      else
        si6->sin6_port = ntohs(port);
#endif
    }
    else
      break;
  }
  {
    char buffer[STRERROR_LEN];
    data->state.os_errno = error = SOCKERRNO;
    failf(data, "bind failed with errno %d: %s",
          error, Curl_strerror(error, buffer, sizeof(buffer)));
  }

  return CURLE_INTERFACE_FAILED;
}